

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::ValueIteratorBase::decrement(ValueIteratorBase *this)

{
  _Base_ptr p_Var1;
  
  p_Var1 = (_Base_ptr)std::_Rb_tree_decrement((this->current_)._M_node);
  (this->current_)._M_node = p_Var1;
  return;
}

Assistant:

void ValueIteratorBase::decrement() {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  --current_;
#else
  if (isArray_)
    ValueInternalArray::decrement(iterator_.array_);
  ValueInternalMap::decrement(iterator_.map_);
#endif
}